

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar4;
  secp256k1_fe *psVar5;
  secp256k1_ge *r_00;
  secp256k1_ge *a_01;
  undefined1 auStack_90 [56];
  uint64_t uStack_58;
  uint64_t uStack_50;
  uint64_t uStack_48;
  uint64_t uStack_40;
  undefined8 uStack_38;
  int iStack_34;
  secp256k1_fe *psStack_30;
  secp256k1_fe *psStack_28;
  
  a_00 = (secp256k1_ge *)a;
  secp256k1_fe_verify(r);
  psVar5 = a;
  secp256k1_fe_verify(a);
  iVar2 = a->magnitude + r->magnitude;
  if (iVar2 < 0x21) {
    r->n[0] = r->n[0] + a->n[0];
    r->n[1] = r->n[1] + a->n[1];
    r->n[2] = r->n[2] + a->n[2];
    r->n[3] = r->n[3] + a->n[3];
    r->n[4] = r->n[4] + a->n[4];
    r->magnitude = iVar2;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_add_cold_1();
  a_01 = (secp256k1_ge *)auStack_90;
  psVar4 = a_00;
  r_00 = a_00;
  psStack_30 = r;
  psStack_28 = a;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity == 0) {
    auStack_90._48_8_ = (a_00->x).n[0];
    uStack_58 = (a_00->x).n[1];
    uStack_50 = (a_00->x).n[2];
    uStack_48 = (a_00->x).n[3];
    uStack_40 = (a_00->x).n[4];
    uStack_38._0_4_ = (a_00->x).magnitude;
    iStack_34 = (a_00->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_90 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_90._0_8_ = (a_00->y).n[0];
    auStack_90._8_8_ = (a_00->y).n[1];
    auStack_90._16_8_ = (a_00->y).n[2];
    auStack_90._24_8_ = (a_00->y).n[3];
    auStack_90._32_8_ = (a_00->y).n[4];
    auStack_90._40_4_ = (a_00->y).magnitude;
    auStack_90._44_4_ = (a_00->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_90);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_34 != 0) {
      psVar5->n[0] = uStack_58 << 0x34 | auStack_90._48_8_;
      psVar5->n[1] = uStack_50 << 0x28 | uStack_58 >> 0xc;
      psVar5->n[2] = uStack_48 << 0x1c | uStack_50 >> 0x18;
      psVar5->n[3] = uStack_40 << 0x10 | uStack_48 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_90);
      if (auStack_90._44_4_ != 0) {
        psVar5->n[4] = auStack_90._8_8_ << 0x34 | auStack_90._0_8_;
        uVar3 = auStack_90._16_8_ << 0x28 | (ulong)auStack_90._8_8_ >> 0xc;
        psVar5->magnitude = (int)uVar3;
        psVar5->normalized = (int)(uVar3 >> 0x20);
        psVar5[1].n[0] = auStack_90._24_8_ << 0x1c | (ulong)auStack_90._16_8_ >> 0x18;
        psVar5[1].n[1] = auStack_90._32_8_ << 0x10 | (ulong)auStack_90._24_8_ >> 0x24;
        return;
      }
      goto LAB_0011aa11;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_01 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_0011aa11:
  secp256k1_ge_to_storage_cold_2();
  (a_01->x).n[0] = (psVar4->x).n[0] & 0xfffffffffffff;
  (a_01->x).n[1] = ((psVar4->x).n[1] & 0xffffffffff) << 0xc | (psVar4->x).n[0] >> 0x34;
  (a_01->x).n[2] = ((psVar4->x).n[2] & 0xfffffff) << 0x18 | (psVar4->x).n[1] >> 0x28;
  (a_01->x).n[3] = ((psVar4->x).n[3] & 0xffff) << 0x24 | (psVar4->x).n[2] >> 0x1c;
  (a_01->x).n[4] = (psVar4->x).n[3] >> 0x10;
  (a_01->x).magnitude = 1;
  (a_01->x).normalized = 1;
  secp256k1_fe_verify(&a_01->x);
  (a_01->y).n[0] = (psVar4->x).n[4] & 0xfffffffffffff;
  uVar3._0_4_ = (psVar4->x).magnitude;
  uVar3._4_4_ = (psVar4->x).normalized;
  (a_01->y).n[1] = (uVar3 & 0xffffffffff) << 0xc | (psVar4->x).n[4] >> 0x34;
  uVar1._0_4_ = (psVar4->x).magnitude;
  uVar1._4_4_ = (psVar4->x).normalized;
  (a_01->y).n[2] = ((psVar4->y).n[0] & 0xfffffff) << 0x18 | uVar1 >> 0x28;
  (a_01->y).n[3] = ((psVar4->y).n[1] & 0xffff) << 0x24 | (psVar4->y).n[0] >> 0x1c;
  (a_01->y).n[4] = (psVar4->y).n[1] >> 0x10;
  (a_01->y).magnitude = 1;
  (a_01->y).normalized = 1;
  secp256k1_fe_verify(&a_01->y);
  a_01->infinity = 0;
  secp256k1_ge_verify(a_01);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe_verify(r);
    secp256k1_fe_verify(a);
    VERIFY_CHECK(r->magnitude + a->magnitude <= 32);
    secp256k1_fe_impl_add(r, a);
    r->magnitude += a->magnitude;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}